

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O2

int Sfm_NtkCollectTfi_rec(Sfm_Ntk_t *p,int iNode,Vec_Int_t *vNodes)

{
  int iVar1;
  int iVar2;
  int k;
  
  iVar1 = Sfm_ObjIsTravIdCurrent(p,iNode);
  if (iVar1 == 0) {
    Sfm_ObjSetTravIdCurrent(p,iNode);
    k = 0;
    iVar1 = 1;
    do {
      iVar2 = Sfm_ObjFaninNum(p,iNode);
      if (iVar2 <= k) {
        Vec_IntPush(vNodes,iNode);
        iVar1 = p->pPars->nWinSizeMax;
        if (iVar1 != 0) {
          return (uint)(iVar1 < vNodes->nSize);
        }
        goto LAB_0045086e;
      }
      iVar2 = Sfm_ObjFanin(p,iNode,k);
      iVar2 = Sfm_NtkCollectTfi_rec(p,iVar2,vNodes);
      k = k + 1;
    } while (iVar2 == 0);
  }
  else {
LAB_0045086e:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Sfm_NtkCollectTfi_rec( Sfm_Ntk_t * p, int iNode, Vec_Int_t * vNodes )
{
    int i, iFanin;
    if ( Sfm_ObjIsTravIdCurrent( p, iNode ) )
        return 0;
    Sfm_ObjSetTravIdCurrent( p, iNode );
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
        if ( Sfm_NtkCollectTfi_rec( p, iFanin, vNodes ) )
            return 1;
    Vec_IntPush( vNodes, iNode );
    return p->pPars->nWinSizeMax && (Vec_IntSize(vNodes) > p->pPars->nWinSizeMax);
}